

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-opengl.c
# Opt level: O2

int main(void)

{
  double dVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLint GVar6;
  GLFWwindow *handle;
  vec4 *pafVar7;
  int i;
  long lVar8;
  long lVar9;
  float fVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  int height;
  int width;
  GLuint vertex_array;
  float local_128;
  float local_124;
  float fStack_120;
  float fStack_11c;
  float fStack_118;
  float local_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  long local_fc;
  undefined8 uStack_f4;
  undefined4 local_ec;
  float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  GLuint vertex_buffer;
  float local_c8;
  mat4x4 mvp;
  mat4x4 m;
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    handle = glfwCreateWindow(0x280,0x1e0,"OpenGL Triangle",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwSetKeyCallback(handle,key_callback);
      glfwMakeContextCurrent(handle);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      (*glad_glGenBuffers)(1,&vertex_buffer);
      (*glad_glBindBuffer)(0x8892,vertex_buffer);
      (*glad_glBufferData)(0x8892,0x3c,vertices,0x88e4);
      GVar3 = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(GVar3,1,&vertex_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar3);
      GVar4 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar4,1,&fragment_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar4);
      GVar5 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar5,GVar3);
      (*glad_glAttachShader)(GVar5,GVar4);
      (*glad_glLinkProgram)(GVar5);
      GVar6 = (*glad_glGetUniformLocation)(GVar5,"MVP");
      GVar3 = (*glad_glGetAttribLocation)(GVar5,"vPos");
      GVar4 = (*glad_glGetAttribLocation)(GVar5,"vCol");
      (*glad_glGenVertexArrays)(1,&vertex_array);
      (*glad_glBindVertexArray)(vertex_array);
      (*glad_glEnableVertexAttribArray)(GVar3);
      (*glad_glVertexAttribPointer)(GVar3,2,0x1406,'\0',0x14,(void *)0x0);
      (*glad_glEnableVertexAttribArray)(GVar4);
      (*glad_glVertexAttribPointer)(GVar4,3,0x1406,'\0',0x14,(void *)0x8);
      while( true ) {
        iVar2 = glfwWindowShouldClose(handle);
        if (iVar2 != 0) break;
        glfwGetFramebufferSize(handle,&width,&height);
        iVar2 = width;
        local_e8 = (float)height;
        (*glad_glViewport)(0,0,width,height);
        (*glad_glClear)(0x4000);
        pafVar7 = m;
        uStack_e4 = extraout_XMM0_Db;
        uStack_e0 = extraout_XMM0_Dc;
        uStack_dc = extraout_XMM0_Dd;
        for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
          for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
            fVar10 = 1.0;
            if (lVar8 != lVar9) {
              fVar10 = 0.0;
            }
            uStack_dc = 0;
            uStack_e0 = 0;
            uStack_e4 = 0;
            (*pafVar7)[lVar9] = fVar10;
          }
          pafVar7 = pafVar7 + 1;
        }
        local_e8 = (float)iVar2 / local_e8;
        dVar1 = glfwGetTime();
        local_c8 = sinf((float)dVar1);
        local_128 = cosf((float)dVar1);
        local_124 = local_c8;
        fStack_120 = 0.0;
        fStack_11c = 0.0;
        fStack_118 = -local_c8;
        uStack_110 = 0;
        uStack_10c = 0;
        uStack_108 = 0;
        uStack_104 = 0;
        uStack_100 = 0x3f800000;
        local_fc = 0;
        uStack_f4 = 0;
        local_ec = 0x3f800000;
        local_114 = local_128;
        mat4x4_mul(m,m,(vec4 *)&local_128);
        local_128 = 2.0 / (local_e8 + local_e8);
        local_124 = 0.0;
        fStack_120 = 0.0;
        fStack_11c = 0.0;
        fStack_118 = 0.0;
        uStack_104 = 0;
        uStack_100 = 0x3f800000;
        local_114 = 1.0;
        uStack_110 = 0;
        uStack_10c = 0;
        uStack_108 = 0;
        local_fc = (ulong)(uint)(-(local_e8 - local_e8) / (local_e8 + local_e8)) << 0x20;
        uStack_f4 = 0x80000000;
        local_ec = 0x3f800000;
        mat4x4_mul(mvp,(vec4 *)&local_128,m);
        (*glad_glUseProgram)(GVar5);
        (*glad_glUniformMatrix4fv)(GVar6,1,'\0',mvp[0]);
        (*glad_glBindVertexArray)(vertex_array);
        (*glad_glDrawArrays)(4,0,3);
        glfwSwapBuffers(handle);
        glfwPollEvents();
      }
      glfwDestroyWindow(handle);
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

    GLFWwindow* window = glfwCreateWindow(640, 480, "OpenGL Triangle", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);

    // NOTE: OpenGL error checks have been omitted for brevity

    GLuint vertex_buffer;
    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    const GLuint vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    const GLuint fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    const GLuint program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    const GLint mvp_location = glGetUniformLocation(program, "MVP");
    const GLint vpos_location = glGetAttribLocation(program, "vPos");
    const GLint vcol_location = glGetAttribLocation(program, "vCol");

    GLuint vertex_array;
    glGenVertexArrays(1, &vertex_array);
    glBindVertexArray(vertex_array);
    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(Vertex), (void*) offsetof(Vertex, pos));
    glEnableVertexAttribArray(vcol_location);
    glVertexAttribPointer(vcol_location, 3, GL_FLOAT, GL_FALSE,
                          sizeof(Vertex), (void*) offsetof(Vertex, col));

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        glfwGetFramebufferSize(window, &width, &height);
        const float ratio = width / (float) height;

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        mat4x4 m, p, mvp;
        mat4x4_identity(m);
        mat4x4_rotate_Z(m, m, (float) glfwGetTime());
        mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 1.f, -1.f);
        mat4x4_mul(mvp, p, m);

        glUseProgram(program);
        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) &mvp);
        glBindVertexArray(vertex_array);
        glDrawArrays(GL_TRIANGLES, 0, 3);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}